

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void __thiscall QWidgetRepaintManager::sync(QWidgetRepaintManager *this)

{
  bool bVar1;
  char cVar2;
  QLoggingCategory *pQVar3;
  QDebug *pQVar4;
  ulong uVar5;
  QPoint QVar6;
  QPlatformTextureList *widgetTextures;
  QRegion *in_RDX;
  QWidget *in_RSI;
  long in_FS_OFFSET;
  QPoint local_80;
  undefined4 uStack_78;
  undefined8 uStack_74;
  undefined4 local_6c;
  char *local_68;
  QDebug local_60;
  QRegion local_58;
  QPoint local_50;
  Stream *local_48;
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QtPrivateLogging::lcWidgetPainting();
  if (((pQVar3->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
    local_68 = pQVar3->name;
    local_80.xp.m_i = 2;
    local_80.yp.m_i = 0;
    uStack_78 = 0;
    uStack_74 = 0;
    local_6c = 0;
    QMessageLogger::info();
    pQVar4 = QDebug::operator<<(&local_60,"Syncing");
    local_58.d = (QRegionData *)pQVar4->stream;
    *(int *)((Stream *)local_58.d + 0x28) = *(int *)((Stream *)local_58.d + 0x28) + 1;
    ::operator<<((Stream *)&local_50,&local_58);
    pQVar4 = QDebug::operator<<((QDebug *)&local_50,"of");
    local_48 = pQVar4->stream;
    *(int *)(local_48 + 0x28) = *(int *)(local_48 + 0x28) + 1;
    ::operator<<((Stream *)local_40,(QWidget *)&local_48);
    QDebug::~QDebug((QDebug *)local_40);
    QDebug::~QDebug((QDebug *)&local_48);
    QDebug::~QDebug((QDebug *)&local_50);
    QDebug::~QDebug((QDebug *)&local_58);
    QDebug::~QDebug(&local_60);
  }
  if ((in_RSI != (QWidget *)0x0) && ((*(uint *)(*(long *)(*(long *)this + 0x20) + 8) & 0x8000) != 0)
     ) {
    bVar1 = hasPlatformWindow(in_RSI);
    if ((bVar1) && ((in_RSI->data->widget_attributes & 0x8c00) == 0x8800)) {
      cVar2 = QRegion::isEmpty();
      if (cVar2 == '\0') {
        bVar1 = isDirty(this);
        if (!bVar1) {
          uVar5 = QBackingStore::size();
          if ((uVar5 & 0x8000000080000000) == 0) {
            widgetTextures = widgetTexturesFor(*(QWidget **)this,in_RSI);
            if (widgetTextures == (QPlatformTextureList *)0x0) {
              QRegion::QRegion((QRegion *)&local_80,in_RDX);
            }
            else {
              QRegion::QRegion((QRegion *)&local_80);
            }
            flush(this,in_RSI,(QRegion *)&local_80,widgetTextures);
            QRegion::~QRegion((QRegion *)&local_80);
            goto LAB_0030dcee;
          }
        }
        if (*(QWidget **)this == in_RSI) {
          local_80.xp.m_i = 0;
          local_80.yp.m_i = 0;
        }
        else {
          local_50.xp.m_i = 0;
          local_50.yp.m_i = 0;
          QVar6 = QWidget::mapTo(in_RSI,*(QWidget **)this,&local_50);
          local_80.xp = QVar6.xp.m_i;
          local_80.yp = QVar6.yp.m_i;
        }
        markNeedsFlush(this,in_RSI,in_RDX,&local_80);
        bVar1 = syncAllowed(this);
        if (bVar1) {
          paintAndFlush(this);
        }
      }
    }
  }
LAB_0030dcee:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::sync(QWidget *exposedWidget, const QRegion &exposedRegion)
{
    qCInfo(lcWidgetPainting) << "Syncing" << exposedRegion << "of" << exposedWidget;

    if (!tlw->isVisible())
        return;

    if (!exposedWidget || !hasPlatformWindow(exposedWidget)
        || !exposedWidget->isVisible() || !exposedWidget->testAttribute(Qt::WA_Mapped)
        || !exposedWidget->updatesEnabled() || exposedRegion.isEmpty()) {
        return;
    }

    // Nothing to repaint.
    if (!isDirty() && store->size().isValid()) {
        QPlatformTextureList *widgetTextures = widgetTexturesFor(tlw, exposedWidget);
        flush(exposedWidget, widgetTextures ? QRegion() : exposedRegion, widgetTextures);
        return;
    }

    // As requests to sync a specific widget typically comes from an expose event
    // we can't rely solely on our own dirty tracking to decide what to flush, and
    // need to respect the platform's request to at least flush the entire widget,
    QPoint offset = exposedWidget != tlw ? exposedWidget->mapTo(tlw, QPoint()) : QPoint();
    markNeedsFlush(exposedWidget, exposedRegion, offset);

    if (syncAllowed())
        paintAndFlush();
}